

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Next
          (ConcatenatingInputStream *this,void **data,int *size)

{
  ulong uVar1;
  long lVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  while( true ) {
    if (*(int *)(in_RDI + 0x10) < 1) {
      return false;
    }
    uVar1 = (**(code **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x10))
                      ((long *)**(undefined8 **)(in_RDI + 8),in_RSI,in_RDX);
    if ((uVar1 & 1) != 0) break;
    lVar2 = (**(code **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x28))();
    *(long *)(in_RDI + 0x18) = lVar2 + *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
  }
  return true;
}

Assistant:

bool ConcatenatingInputStream::Next(const void** data, int* size) {
  while (stream_count_ > 0) {
    if (streams_[0]->Next(data, size)) return true;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += streams_[0]->ByteCount();
    ++streams_;
    --stream_count_;
  }

  // No more streams.
  return false;
}